

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pBlendTests.cpp
# Opt level: O1

int __thiscall deqp::gles2::Performance::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Context *pCVar7;
  int extraout_EAX;
  ShaderPerformanceCase *this_00;
  long lVar8;
  
  lVar8 = 0x1c;
  do {
    this_00 = (ShaderPerformanceCase *)operator_new(0x1d8);
    pCVar7 = (this->super_TestCaseGroup).m_context;
    uVar1 = *(undefined4 *)((long)&PTR_deinit_0217e728 + lVar8 + 4);
    uVar2 = *(undefined4 *)((long)&PTR_iterate_0217e730 + lVar8);
    uVar3 = *(undefined4 *)((long)&PTR_iterate_0217e730 + lVar8 + 4);
    uVar4 = *(undefined4 *)(&UNK_0217e738 + lVar8);
    uVar5 = *(undefined4 *)(&UNK_0217e73c + lVar8);
    uVar6 = *(undefined4 *)((long)&init::cases[0].name + lVar8);
    deqp::gls::ShaderPerformanceCase::ShaderPerformanceCase
              (this_00,pCVar7->m_testCtx,pCVar7->m_renderCtx,
               *(char **)((long)&PTR_init_0217e720 + lVar8 + 4),
               glcts::fixed_sample_locations_values + 1,CASETYPE_FRAGMENT);
    (this_00->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BlendCase_0217e6c0
    ;
    *(undefined4 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = uVar2;
    *(undefined4 *)&this_00[1].super_TestCase.super_TestNode.m_testCtx = uVar3;
    *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode.m_testCtx + 4) = uVar4;
    *(undefined4 *)&this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = uVar5;
    *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         uVar6;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x1bc);
  return extraout_EAX;
}

Assistant:

void BlendTests::init (void)
{
	static const struct
	{
		const char*	name;
		GLenum		modeRGB;
		GLenum		modeAlpha;
		GLenum		srcRGB;
		GLenum		dstRGB;
		GLenum		srcAlpha;
		GLenum		dstAlpha;
	} cases[] =
	{
		// Single blend func, factor one.
		{ "add",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "subtract",					GL_FUNC_SUBTRACT,			GL_FUNC_SUBTRACT,			GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},
		{ "reverse_subtract",			GL_FUNC_REVERSE_SUBTRACT,	GL_FUNC_REVERSE_SUBTRACT,	GL_ONE,		GL_ONE,		GL_ONE,		GL_ONE		},

		// Porter-duff modes that can be implemented.
		{ "dst_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_SRC_ALPHA,				GL_ONE,					GL_ZERO					},
		{ "dst_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_SRC_ALPHA,				GL_ZERO,				GL_SRC_ALPHA			},
		{ "dst_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ZERO,					GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE_MINUS_SRC_ALPHA	},
		{ "dst_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ONE,						GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "src_atop",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ONE_MINUS_SRC_ALPHA,		GL_ZERO,				GL_ONE					},
		{ "src_in",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_ALPHA,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "src_out",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE_MINUS_DST_ALPHA,		GL_ZERO,					GL_ONE_MINUS_DST_ALPHA,	GL_ZERO					},
		{ "src_over",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_ALPHA,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	},
		{ "multiply",					GL_FUNC_ADD,				GL_FUNC_ADD,				GL_DST_COLOR,				GL_ZERO,					GL_DST_ALPHA,			GL_ZERO					},
		{ "screen",						GL_FUNC_ADD,				GL_FUNC_ADD,				GL_ONE,						GL_ONE_MINUS_SRC_COLOR,		GL_ONE,					GL_ONE_MINUS_SRC_ALPHA	}
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); caseNdx++)
		addChild(new BlendCase(m_context, cases[caseNdx].name, "", cases[caseNdx].modeRGB, cases[caseNdx].modeAlpha, cases[caseNdx].srcRGB, cases[caseNdx].dstRGB, cases[caseNdx].srcAlpha, cases[caseNdx].dstAlpha));
}